

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O1

Map_Man_t *
Abc_NtkToMap(Abc_Ntk_t *pNtk,double DelayTarget,int fRecovery,float *pSwitching,int fVerbose)

{
  uint uVar1;
  void *pvVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  int iVar7;
  Map_Man_t *p;
  char **ppNames;
  Abc_Time_t *pAVar8;
  Map_Time_t *pMVar9;
  Map_Node_t *pMVar10;
  Abc_Obj_t *pAVar11;
  Map_Node_t **ppMVar12;
  Vec_Ptr_t *pVVar13;
  ulong uVar14;
  char *__assertion;
  ulong uVar15;
  long lVar16;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMap.c"
                  ,0xe3,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
  }
  p = Map_ManCreate((pNtk->vPis->nSize + pNtk->nObjCounts[8]) - pNtk->nBarBufs,
                    (pNtk->nObjCounts[8] - pNtk->nBarBufs) + pNtk->vPos->nSize,fVerbose);
  if (p == (Map_Man_t *)0x0) {
    p = (Map_Man_t *)0x0;
  }
  else {
    Map_ManSetAreaRecovery(p,fRecovery);
    ppNames = Abc_NtkCollectCioNames(pNtk,1);
    Map_ManSetOutputNames(p,ppNames);
    Map_ManSetDelayTarget(p,(float)DelayTarget);
    pAVar8 = Abc_NtkGetCiArrivalTimes(pNtk);
    pMVar9 = Abc_NtkMapCopyCiArrival(pNtk,pAVar8);
    Map_ManSetInputArrivals(p,pMVar9);
    pAVar8 = Abc_NtkGetCoRequiredTimes(pNtk);
    pMVar9 = Abc_NtkMapCopyCoRequired(pNtk,pAVar8);
    Map_ManSetOutputRequireds(p,pMVar9);
    Abc_NtkCleanCopy(pNtk);
    pMVar10 = Map_ManReadConst1(p);
    pAVar11 = Abc_AigConst1(pNtk);
    (pAVar11->field_6).pCopy = (Abc_Obj_t *)pMVar10;
    pVVar13 = pNtk->vCis;
    uVar14 = (ulong)(uint)pVVar13->nSize;
    if (0 < pVVar13->nSize) {
      uVar15 = 0;
      do {
        if (uVar15 == (uint)((int)uVar14 - pNtk->nBarBufs)) break;
        pvVar2 = pVVar13->pArray[uVar15];
        ppMVar12 = Map_ManReadInputs(p);
        pMVar10 = ppMVar12[uVar15];
        *(Map_Node_t **)((long)pvVar2 + 0x40) = pMVar10;
        if (pSwitching != (float *)0x0) {
          Map_NodeSetSwitching(pMVar10,pSwitching[*(int *)((long)pvVar2 + 0x10)]);
        }
        uVar15 = uVar15 + 1;
        pVVar13 = pNtk->vCis;
        uVar14 = (ulong)pVVar13->nSize;
      } while ((long)uVar15 < (long)uVar14);
    }
    pVVar13 = Abc_AigDfsMap(pNtk);
    if (0 < pVVar13->nSize) {
      lVar16 = 0;
      do {
        plVar3 = (long *)pVVar13->pArray[lVar16];
        uVar1 = *(uint *)((long)plVar3 + 0x14);
        if ((uVar1 & 0xf) == 7) {
          lVar5 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
          pMVar10 = Map_NodeAnd(p,(Map_Node_t *)
                                  ((ulong)(uVar1 >> 10 & 1) ^
                                  *(ulong *)(*(long *)(lVar5 + (long)*(int *)plVar3[4] * 8) + 0x40))
                                ,(Map_Node_t *)
                                 ((ulong)(uVar1 >> 0xb & 1) ^
                                 *(ulong *)(*(long *)(lVar5 + (long)((int *)plVar3[4])[1] * 8) +
                                           0x40)));
          if (plVar3[8] != 0) {
            __assert_fail("pNode->pCopy == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMap.c"
                          ,0x10c,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
          }
          plVar3[8] = (long)pMVar10;
          if (pSwitching != (float *)0x0) {
            Map_NodeSetSwitching(pMVar10,pSwitching[(int)plVar3[2]]);
          }
          if (((ulong)plVar3 & 1) != 0) {
            __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_0026b717:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                          ,399,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
          }
          if (*(int *)*plVar3 != 3) {
            __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
            goto LAB_0026b717;
          }
          if ((plVar3[7] != 0) && (0 < *(int *)((long)plVar3 + 0x2c))) {
            plVar4 = plVar3;
            for (plVar6 = (long *)plVar3[7]; plVar6 != (long *)0x0; plVar6 = (long *)plVar6[7]) {
              Map_NodeSetNextE((Map_Node_t *)plVar4[8],(Map_Node_t *)plVar6[8]);
              Map_NodeSetRepr((Map_Node_t *)plVar6[8],(Map_Node_t *)plVar3[8]);
              plVar4 = plVar6;
            }
          }
        }
        else {
          if ((uVar1 & 0xf) != 8) {
            __assert_fail("Abc_ObjIsNode(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMap.c"
                          ,0x107,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
          }
          plVar4 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8
                             );
          pMVar10 = Map_NodeBuf(p,(Map_Node_t *)
                                  ((ulong)(*(uint *)((long)plVar4 + 0x14) >> 10 & 1) ^
                                  *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                                      (long)*(int *)plVar4[4] * 8) + 0x40)));
          *(Map_Node_t **)
           (*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8) + 0x40
           ) = pMVar10;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < pVVar13->nSize);
    }
    iVar7 = Map_ManReadBufNum(p);
    if (iVar7 != pNtk->nBarBufs) {
      __assert_fail("Map_ManReadBufNum(pMan) == pNtk->nBarBufs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMap.c"
                    ,0x119,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
    }
    if (pVVar13->pArray != (void **)0x0) {
      free(pVVar13->pArray);
      pVVar13->pArray = (void **)0x0;
    }
    if (pVVar13 != (Vec_Ptr_t *)0x0) {
      free(pVVar13);
    }
    pVVar13 = pNtk->vCos;
    uVar14 = (ulong)(uint)pVVar13->nSize;
    if (0 < pVVar13->nSize) {
      uVar15 = 0;
      do {
        if (uVar15 == (uint)((int)uVar14 - pNtk->nBarBufs)) {
          return p;
        }
        plVar3 = (long *)pVVar13->pArray[uVar15];
        uVar1 = *(uint *)((long)plVar3 + 0x14);
        uVar14 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                     (long)*(int *)plVar3[4] * 8) + 0x40);
        ppMVar12 = Map_ManReadOutputs(p);
        ppMVar12[uVar15] = (Map_Node_t *)(uVar1 >> 10 & 1 ^ uVar14);
        uVar15 = uVar15 + 1;
        pVVar13 = pNtk->vCos;
        uVar14 = (ulong)pVVar13->nSize;
      } while ((long)uVar15 < (long)uVar14);
    }
  }
  return p;
}

Assistant:

Map_Man_t * Abc_NtkToMap( Abc_Ntk_t * pNtk, double DelayTarget, int fRecovery, float * pSwitching, int fVerbose )
{
    Map_Man_t * pMan;
    Map_Node_t * pNodeMap;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanin, * pPrev;
    int i;

    assert( Abc_NtkIsStrash(pNtk) );

    // start the mapping manager and set its parameters
    pMan = Map_ManCreate( Abc_NtkPiNum(pNtk) + Abc_NtkLatchNum(pNtk) - pNtk->nBarBufs, Abc_NtkPoNum(pNtk) + Abc_NtkLatchNum(pNtk) - pNtk->nBarBufs, fVerbose );
    if ( pMan == NULL )
        return NULL;
    Map_ManSetAreaRecovery( pMan, fRecovery );
    Map_ManSetOutputNames( pMan, Abc_NtkCollectCioNames(pNtk, 1) );
    Map_ManSetDelayTarget( pMan, (float)DelayTarget );
    Map_ManSetInputArrivals( pMan, Abc_NtkMapCopyCiArrival(pNtk, Abc_NtkGetCiArrivalTimes(pNtk)) );
    Map_ManSetOutputRequireds( pMan, Abc_NtkMapCopyCoRequired(pNtk, Abc_NtkGetCoRequiredTimes(pNtk)) );

    // create PIs and remember them in the old nodes
    Abc_NtkCleanCopy( pNtk );
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Map_ManReadConst1(pMan);
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        if ( i == Abc_NtkCiNum(pNtk) - pNtk->nBarBufs )
            break;
        pNodeMap = Map_ManReadInputs(pMan)[i];
        pNode->pCopy = (Abc_Obj_t *)pNodeMap;
        if ( pSwitching )
            Map_NodeSetSwitching( pNodeMap, pSwitching[pNode->Id] );
    }

    // load the AIG into the mapper
    vNodes = Abc_AigDfsMap( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjIsLatch(pNode) )
        {
            pFanin = Abc_ObjFanin0(pNode);
            pNodeMap = Map_NodeBuf( pMan, Map_NotCond( Abc_ObjFanin0(pFanin)->pCopy, (int)Abc_ObjFaninC0(pFanin) ) );
            Abc_ObjFanout0(pNode)->pCopy = (Abc_Obj_t *)pNodeMap;
            continue;
        }
        assert( Abc_ObjIsNode(pNode) );
        // add the node to the mapper
        pNodeMap = Map_NodeAnd( pMan, 
            Map_NotCond( Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) ),
            Map_NotCond( Abc_ObjFanin1(pNode)->pCopy, (int)Abc_ObjFaninC1(pNode) ) );
        assert( pNode->pCopy == NULL );
        // remember the node
        pNode->pCopy = (Abc_Obj_t *)pNodeMap;
        if ( pSwitching )
            Map_NodeSetSwitching( pNodeMap, pSwitching[pNode->Id] );
        // set up the choice node
        if ( Abc_AigNodeIsChoice( pNode ) )
            for ( pPrev = pNode, pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pPrev = pFanin, pFanin = (Abc_Obj_t *)pFanin->pData )
            {
                Map_NodeSetNextE( (Map_Node_t *)pPrev->pCopy, (Map_Node_t *)pFanin->pCopy );
                Map_NodeSetRepr( (Map_Node_t *)pFanin->pCopy, (Map_Node_t *)pNode->pCopy );
            }
    }
    assert( Map_ManReadBufNum(pMan) == pNtk->nBarBufs );
    Vec_PtrFree( vNodes );

    // set the primary outputs in the required phase
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        if ( i == Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            break;
        Map_ManReadOutputs(pMan)[i] = Map_NotCond( (Map_Node_t *)Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) );
    }
    return pMan;
}